

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.cpp
# Opt level: O2

int __thiscall
llvm::MCRegisterInfo::getDwarfRegNumFromDwarfEHRegNum(MCRegisterInfo *this,uint RegNum)

{
  uint *puVar1;
  OptionalStorage<unsigned_int,_true> local_20;
  Optional<unsigned_int> LRegNum;
  
  local_20 = (OptionalStorage<unsigned_int,_true>)getLLVMRegNum(this,RegNum,true);
  if (((ulong)local_20 >> 0x20 & 1) != 0) {
    puVar1 = optional_detail::OptionalStorage<unsigned_int,_true>::getValue(&local_20);
    RegNum = getDwarfRegNum(this,(MCRegister)*puVar1,false);
  }
  return RegNum;
}

Assistant:

int MCRegisterInfo::getDwarfRegNumFromDwarfEHRegNum(unsigned RegNum) const {
  // On ELF platforms, DWARF EH register numbers are the same as DWARF
  // other register numbers.  On Darwin x86, they differ and so need to be
  // mapped.  The .cfi_* directives accept integer literals as well as
  // register names and should generate exactly what the assembly code
  // asked for, so there might be DWARF/EH register numbers that don't have
  // a corresponding LLVM register number at all.  So if we can't map the
  // EH register number to an LLVM register number, assume it's just a
  // valid DWARF register number as is.
  if (Optional<unsigned> LRegNum = getLLVMRegNum(RegNum, true))
    return getDwarfRegNum(*LRegNum, false);
  return RegNum;
}